

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_window.cpp
# Opt level: O0

void __thiscall sdl::window::window(window *this,u8string *title,SDL_Rect *window_rect)

{
  char8_t *pcVar1;
  SDL_Window *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  SDL_Rect *local_20;
  SDL_Rect *window_rect_local;
  u8string *title_local;
  window *this_local;
  
  local_20 = window_rect;
  window_rect_local = (SDL_Rect *)title;
  title_local = (u8string *)this;
  pcVar1 = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
           ::c_str(title);
  SDL_LogDebug(5,"Creating window \"%s\" at %d:%d with the size of %dx%d",pcVar1,local_20->x,
               local_20->y,local_20->w,local_20->h);
  pcVar1 = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
           ::c_str((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                   window_rect_local);
  pSVar2 = (SDL_Window *)SDL_CreateWindow(pcVar1,local_20->x,local_20->y,local_20->w,local_20->h,0);
  this->m_window = pSVar2;
  pSVar2 = this->m_window;
  s_abi_cxx11_(&local_40,"Failed to create window",0x17);
  sdl_check_null(pSVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

window::window(const std::u8string& title, const SDL_Rect& window_rect)
{
	SDL_LogDebug(SDL_LOG_CATEGORY_VIDEO, "Creating window \"%s\" at %d:%d with the size of %dx%d",
		reinterpret_cast<const char*>(title.c_str()), window_rect.x, window_rect.y,
		window_rect.w, window_rect.h);

	// Create window
	this->m_window = SDL_CreateWindow(reinterpret_cast<const char*>(title.c_str()),
		window_rect.x, window_rect.y, window_rect.w, window_rect.h, 0);

	sdl::sdl_check_null(this->m_window, "Failed to create window"s);
}